

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_writer.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  string module_name;
  string local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_b8 [48];
  undefined1 local_88 [48];
  AlphaNum local_58;
  
  bVar1 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar1) {
    if (this->for_bundled_proto_ != true) {
      return;
    }
    local_e8._M_dataplus._M_p = (pointer)0x3;
    local_e8._M_string_length = 0x541a49;
    FilePathBasename_abi_cxx11_(&local_108,(objectivec *)file,file_00);
    local_b8._0_8_ = local_108._M_string_length;
    local_b8._8_8_ = local_108._M_dataplus._M_p;
    local_58.piece_._M_str = (header_extension->_M_dataplus)._M_p;
    local_58.piece_._M_len = header_extension->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_88,(lts_20250127 *)&local_e8,(AlphaNum *)local_b8,&local_58,in_R8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->protobuf_imports_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    local_b8._16_8_ = local_88._16_8_;
    local_148._M_dataplus._M_p = (pointer)local_88._0_8_;
    if ((undefined1 *)local_88._0_8_ == local_88 + 0x10) goto LAB_002cb64e;
  }
  else {
    ModuleForFile_abi_cxx11_(&local_108,this,file);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)(this->generate_for_named_framework_)._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FilePath_abi_cxx11_((string *)local_b8,(objectivec *)file,file_01);
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   (local_b8,(ulong)(header_extension->_M_dataplus)._M_p);
        psVar3 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_e8.field_2._M_allocated_capacity = *psVar3;
          local_e8.field_2._8_8_ = plVar2[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar3;
          local_e8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_e8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->other_imports_,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        local_148._M_dataplus._M_p = (pointer)local_b8._0_8_;
        if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) goto LAB_002cb64e;
        goto LAB_002cb646;
      }
      local_e8._M_string_length = (size_type)(this->generate_for_named_framework_)._M_dataplus._M_p;
      local_b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_b8._8_8_ = "/";
      FilePathBasename_abi_cxx11_(&local_148,(objectivec *)file,file_01);
      local_58.piece_._M_len = local_148._M_string_length;
      local_58.piece_._M_str = local_148._M_dataplus._M_p;
      local_88._8_8_ = (header_extension->_M_dataplus)._M_p;
      local_88._0_8_ = header_extension->_M_string_length;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_128,(lts_20250127 *)&local_e8,(AlphaNum *)local_b8,&local_58,
                 (AlphaNum *)local_88,in_R9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&local_128);
    }
    else {
      local_e8._M_dataplus._M_p = (pointer)local_108._M_string_length;
      local_e8._M_string_length = (size_type)local_108._M_dataplus._M_p;
      local_b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_b8._8_8_ = "/";
      FilePathBasename_abi_cxx11_(&local_148,(objectivec *)file,file_01);
      local_58.piece_._M_len = local_148._M_string_length;
      local_58.piece_._M_str = local_148._M_dataplus._M_p;
      local_88._8_8_ = (header_extension->_M_dataplus)._M_p;
      local_88._0_8_ = header_extension->_M_string_length;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_128,(lts_20250127 *)&local_e8,(AlphaNum *)local_b8,&local_58,
                 (AlphaNum *)local_88,in_R9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_b8._16_8_ = local_148.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_002cb64e;
  }
LAB_002cb646:
  operator_delete(local_148._M_dataplus._M_p,local_b8._16_8_ + 1);
LAB_002cb64e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const std::string& header_extension) {
  if (IsProtobufLibraryBundledProtoFile(file)) {
    // The imports of the WKTs are only needed within the library itself,
    // in other cases, they get skipped because the generated code already
    // import GPBProtocolBuffers.h and hence proves them.
    if (for_bundled_proto_) {
      protobuf_imports_.emplace_back(
          absl::StrCat("GPB", FilePathBasename(file), header_extension));
    }
    return;
  }

  auto module_name = ModuleForFile(file);

  if (!module_name.empty()) {
    other_framework_imports_.emplace_back(absl::StrCat(
        module_name, "/", FilePathBasename(file), header_extension));
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        absl::StrCat(generate_for_named_framework_, "/", FilePathBasename(file),
                     header_extension));
    return;
  }

  other_imports_.push_back(FilePath(file) + header_extension);
}